

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void aom_comp_mask_upsampled_pred
               (MACROBLOCKD *xd,AV1_COMMON *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred,
               uint8_t *pred,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref,
               int ref_stride,uint8_t *mask,int mask_stride,int invert_mask,int subpel_search)

{
  uint8_t *in_R9;
  uint8_t *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  uint8_t *in_stack_00000030;
  int in_stack_00000038;
  uint8_t *in_stack_00009218;
  MV *in_stack_00009220;
  int in_stack_00009228;
  int in_stack_0000922c;
  AV1Common *in_stack_00009230;
  MACROBLOCKD *in_stack_00009238;
  int in_stack_000092f0;
  int in_stack_000092f8;
  int in_stack_00009300;
  int in_stack_00009308;
  uint8_t *in_stack_00009310;
  int in_stack_00009318;
  int in_stack_00009320;
  
  if (in_stack_00000020 != 0 || in_stack_00000028 != 0) {
    aom_upsampled_pred_sse2
              (in_stack_00009238,in_stack_00009230,in_stack_0000922c,in_stack_00009228,
               in_stack_00009220,in_stack_00009218,in_stack_000092f0,in_stack_000092f8,
               in_stack_00009300,in_stack_00009308,in_stack_00009310,in_stack_00009318,
               in_stack_00009320);
    in_stack_00000038 = in_stack_00000010;
    in_stack_00000030 = in_R9;
  }
  (*aom_comp_mask_pred)
            (in_R9,in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000030,
             in_stack_00000038,comp_pred,(int)mv,mi_col);
  return;
}

Assistant:

void aom_comp_mask_upsampled_pred(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                  int mi_row, int mi_col, const MV *const mv,
                                  uint8_t *comp_pred, const uint8_t *pred,
                                  int width, int height, int subpel_x_q3,
                                  int subpel_y_q3, const uint8_t *ref,
                                  int ref_stride, const uint8_t *mask,
                                  int mask_stride, int invert_mask,
                                  int subpel_search) {
  if (subpel_x_q3 | subpel_y_q3) {
    aom_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred, width, height,
                       subpel_x_q3, subpel_y_q3, ref, ref_stride,
                       subpel_search);
    ref = comp_pred;
    ref_stride = width;
  }
  aom_comp_mask_pred(comp_pred, pred, width, height, ref, ref_stride, mask,
                     mask_stride, invert_mask);
}